

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sip_decomposer.cc
# Opt level: O3

HomomorphismResult *
gss::solve_sip_by_decomposition
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  size_t *psVar1;
  _Rb_tree_color _Var2;
  HomomorphismResult *pHVar3;
  undefined1 *puVar4;
  InputGraph *this;
  size_t __val;
  _Base_ptr p_Var5;
  uint uVar6;
  bool bVar7;
  bool e;
  int iVar8;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  _List_node_base *p_Var11;
  undefined8 uVar12;
  _Rb_tree_node_base *p_Var13;
  loooong *plVar14;
  undefined4 uVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  limb_type lVar17;
  _Base_ptr p_Var18;
  size_t sVar19;
  ulong uVar20;
  limb_type lVar21;
  int iVar22;
  data_type *__src;
  _Base_ptr p_Var23;
  _Base_ptr p_Var24;
  ulong uVar25;
  HomomorphismParams *pHVar26;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar27;
  set<int,_std::less<int>,_std::allocator<int>_> t_avail;
  VertexToVertexMapping sub_mapping;
  InputGraph reduced_pattern;
  vector<int,_std::allocator<int>_> original_to_reduced;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  denominator;
  vector<int,_std::allocator<int>_> reduced_to_original;
  loooong solution_multiplier;
  set<int,_std::less<int>,_std::allocator<int>_> isolated_pattern_vertices;
  number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
  cf;
  undefined1 local_208 [16];
  data_type local_1f8;
  _Base_ptr local_1e8;
  size_t local_1e0;
  HomomorphismResult *local_1d8;
  number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  local_1c9;
  undefined1 local_1c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [2];
  HomomorphismParams *local_198;
  InputGraph local_190;
  vector<int,_std::allocator<int>_> local_188;
  data_type local_168;
  undefined8 local_158;
  void *local_148;
  iterator iStack_140;
  int *local_138;
  data_type local_128;
  undefined4 local_118;
  undefined2 local_114;
  char local_112;
  data_type local_108;
  undefined4 local_f8;
  byte local_f4;
  undefined2 local_f3;
  InputGraph *local_e0;
  data_type local_d8;
  undefined4 local_c8;
  undefined2 local_c4;
  char local_c2;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_b8;
  uint local_88 [2];
  void *local_80;
  char local_73;
  char local_72;
  data_type local_68;
  undefined4 local_58;
  undefined2 local_54;
  char local_52;
  expression<boost::multiprecision::detail::function,_boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void>
  local_48;
  
  local_b8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_b8._M_impl.super__Rb_tree_header._M_header;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0 = target;
  local_b8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((((((params->induced == false) &&
         ((params->pattern_less_constraints).
          super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next ==
          (_List_node_base *)&params->pattern_less_constraints)) &&
        ((params->target_occur_less_constraints).
         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next ==
         (_List_node_base *)&params->target_occur_less_constraints)) &&
       (((params->lackey)._M_t.
         super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>.
         _M_t.
         super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
         super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl == (Lackey *)0x0 &&
        (bVar7 = InputGraph::has_vertex_labels(pattern), !bVar7)))) &&
      ((params->count_solutions != true ||
       ((params->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)))) &&
     (bVar7 = InputGraph::directed(pattern), !bVar7)) {
    local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
    iVar8 = InputGraph::size(pattern);
    if (0 < iVar8) {
      do {
        iVar8 = InputGraph::degree(pattern,local_208._0_4_);
        if (iVar8 == 0) {
          std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_emplace_unique<int&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &local_b8,(int *)local_208);
        }
        iVar22 = local_208._0_4_ + 1;
        local_208._0_4_ = iVar22;
        iVar8 = InputGraph::size(pattern);
      } while (iVar22 < iVar8);
    }
  }
  if (local_b8._M_impl.super__Rb_tree_header._M_node_count == 0) {
    solve_homomorphism_problem(__return_storage_ptr__,pattern,local_e0,params);
    goto LAB_0012884a;
  }
  local_198 = params;
  iVar8 = InputGraph::size(pattern);
  iVar8 = iVar8 - (int)local_b8._M_impl.super__Rb_tree_header._M_node_count;
  bVar7 = InputGraph::has_vertex_labels(pattern);
  e = InputGraph::has_edge_labels(pattern);
  InputGraph::InputGraph(&local_190,iVar8,bVar7,e);
  iVar8 = 0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_138 = (int *)0x0;
  local_148 = (void *)0x0;
  iStack_140._M_current = (int *)0x0;
  while( true ) {
    local_208._0_4_ = iVar8;
    iVar22 = InputGraph::size(pattern);
    if (iVar22 <= iVar8) break;
    if (local_b8._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00127ea4:
      local_1c8._0_4_ = (undefined4)((ulong)((long)iStack_140._M_current - (long)local_148) >> 2);
      if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1c8);
      }
      else {
        *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_1c8._0_4_;
        local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (iStack_140._M_current == local_138) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_148,iStack_140,(int *)local_208);
      }
      else {
        *iStack_140._M_current = local_208._0_4_;
        iStack_140._M_current = iStack_140._M_current + 1;
      }
    }
    else {
      p_Var5 = local_b8._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var24 = &local_b8._M_impl.super__Rb_tree_header._M_header;
      do {
        p_Var23 = p_Var24;
        p_Var18 = p_Var5;
        _Var2 = p_Var18[1]._M_color;
        p_Var24 = p_Var18;
        if ((int)_Var2 < (int)local_208._0_4_) {
          p_Var24 = p_Var23;
        }
        p_Var5 = (&p_Var18->_M_left)[(int)_Var2 < (int)local_208._0_4_];
      } while ((&p_Var18->_M_left)[(int)_Var2 < (int)local_208._0_4_] != (_Base_ptr)0x0);
      if ((_Rb_tree_header *)p_Var24 == &local_b8._M_impl.super__Rb_tree_header) goto LAB_00127ea4;
      if ((int)_Var2 < (int)local_208._0_4_) {
        p_Var18 = p_Var23;
      }
      if ((int)local_208._0_4_ < (int)p_Var18[1]._M_color) goto LAB_00127ea4;
      local_1c8._0_4_ = 0xffffffff;
      if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_188,
                   (iterator)
                   local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)local_1c8);
      }
      else {
        *local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = -1;
        local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    iVar8 = local_208._0_4_ + 1;
  }
  local_1d8 = __return_storage_ptr__;
  for (uVar25 = 0; pHVar3 = local_1d8, iVar8 = InputGraph::size(pattern), this = local_e0,
      (long)uVar25 < (long)iVar8; uVar25 = uVar25 + 1) {
    if ((ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) <= uVar25) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar25)
      ;
    }
    iVar8 = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar25];
    if (iVar8 != -1) {
      for (uVar20 = 0; iVar22 = InputGraph::size(pattern), (long)uVar20 < (long)iVar22;
          uVar20 = uVar20 + 1) {
        if ((ulong)((long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar20) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar20);
        }
        iVar22 = local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar20];
        if ((iVar22 != -1) && (bVar7 = InputGraph::adjacent(pattern,(int)uVar25,(int)uVar20), bVar7)
           ) {
          InputGraph::add_directed_edge
                    (&local_190,iVar8,iVar22,(string_view)(ZEXT816(0x17f2bd) << 0x40));
        }
      }
    }
  }
  solve_homomorphism_problem(pHVar3,&local_190,local_e0,local_198);
  __val = local_b8._M_impl.super__Rb_tree_header._M_node_count;
  uVar9 = 1;
  if (9 < local_b8._M_impl.super__Rb_tree_header._M_node_count) {
    sVar19 = local_b8._M_impl.super__Rb_tree_header._M_node_count;
    uVar6 = 4;
    do {
      uVar9 = uVar6;
      if (sVar19 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001280bc;
      }
      if (sVar19 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001280bc;
      }
      if (sVar19 < 10000) goto LAB_001280bc;
      bVar7 = 99999 < sVar19;
      sVar19 = sVar19 / 10000;
      uVar6 = uVar9 + 4;
    } while (bVar7);
    uVar9 = uVar9 + 1;
  }
LAB_001280bc:
  local_1c8._0_8_ = local_1b8;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
             (ulong)uVar9,'\0');
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1c8._0_8_,local_1c8._8_4_,__val);
  pbVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c8,0,0,"isolated_pattern_vertices = ",0x1c);
  pHVar26 = local_198;
  paVar16 = &pbVar10->field_2;
  local_208._0_8_ = (pbVar10->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._0_8_ == paVar16) {
    local_1f8.la[0] = paVar16->_M_allocated_capacity;
    local_1f8.ld.data = (limb_pointer)*(long *)((long)&pbVar10->field_2 + 8);
    local_208._0_8_ = &local_1f8;
  }
  else {
    local_1f8.la[0] = paVar16->_M_allocated_capacity;
  }
  local_208._8_8_ = pbVar10->_M_string_length;
  (pbVar10->_M_dataplus)._M_p = (pointer)paVar16;
  pbVar10->_M_string_length = 0;
  (pbVar10->field_2)._M_local_buf[0] = '\0';
  p_Var11 = (_List_node_base *)operator_new(0x30);
  uVar12 = local_208._8_8_;
  p_Var11[1]._M_next = p_Var11 + 2;
  if ((data_type *)local_208._0_8_ == &local_1f8) {
    p_Var11[2]._M_next = (_List_node_base *)local_1f8.la[0];
    p_Var11[2]._M_prev = (_List_node_base *)local_1f8.ld.data;
  }
  else {
    p_Var11[1]._M_next = (_List_node_base *)local_208._0_8_;
    p_Var11[2]._M_next = (_List_node_base *)local_1f8.la[0];
  }
  local_208._8_8_ = (data_type *)0x0;
  local_1f8.la[0] = local_1f8.la[0] & 0xffffffffffffff00;
  p_Var11[1]._M_prev = (_List_node_base *)uVar12;
  local_208._0_8_ = &local_1f8;
  std::__detail::_List_node_base::_M_hook(p_Var11);
  psVar1 = &(local_1d8->extra_stats).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  if ((data_type *)local_208._0_8_ != &local_1f8) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_1f8.la[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._0_8_ != local_1b8) {
    operator_delete((void *)local_1c8._0_8_,
                    CONCAT17(local_1b8[0]._M_local_buf[7],
                             CONCAT16(local_1b8[0]._M_local_buf[6],
                                      CONCAT15(local_1b8[0]._M_local_buf[5],
                                               CONCAT14(local_1b8[0]._M_local_buf[4],
                                                        (undefined4)
                                                        local_1b8[0]._M_allocated_capacity)))) + 1);
  }
  __return_storage_ptr__ = local_1d8;
  if ((local_1d8->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_1f8.ld.data = (limb_pointer)(local_208 + 8);
    iVar8 = 0;
    local_208._8_8_ = local_208._8_8_ & 0xffffffff00000000;
    local_1f8.la[0] = 0;
    local_1e0 = 0;
    local_1e8 = (_Base_ptr)local_1f8.ld.data;
    while( true ) {
      local_1c8._0_4_ = iVar8;
      iVar22 = InputGraph::size(this);
      pHVar3 = local_1d8;
      if (iVar22 <= iVar8) break;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_emplace_unique<int&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 local_208,(int *)local_1c8);
      iVar8 = local_1c8._0_4_ + 1;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_1c8,
               (_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                *)local_1d8);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)pHVar3);
    __return_storage_ptr__ = local_1d8;
    uVar12 = local_1b8[0]._8_8_;
    p_Var13 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    while (local_1d8 = __return_storage_ptr__,
          local_b8._M_impl.super__Rb_tree_header._M_header._M_left = p_Var13,
          (_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)(local_1c8 + 8)) {
      pVar27 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
               equal_range((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                            *)local_208,
                           (key_type *)&((_Rb_tree_node_base *)(uVar12 + 0x20))->field_0x4);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   local_208,(_Base_ptr)pVar27.first._M_node,(_Base_ptr)pVar27.second._M_node);
      if ((ulong)((long)iStack_140._M_current - (long)local_148 >> 2) <=
          (ulong)(long)(int)((_Rb_tree_node_base *)(uVar12 + 0x20))->_M_color) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int&,int&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)local_1d8,
                 (int *)((long)local_148 +
                        (long)(int)((_Rb_tree_node_base *)(uVar12 + 0x20))->_M_color * 4),
                 (int *)&((_Rb_tree_node_base *)(uVar12 + 0x20))->field_0x4);
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
      __return_storage_ptr__ = local_1d8;
      p_Var13 = local_b8._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    if ((_Rb_tree_header *)p_Var13 != &local_b8._M_impl.super__Rb_tree_header) {
      do {
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int_const&,int_const&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,(int *)(p_Var13 + 1),(int *)(local_1f8.la[1] + 0x20));
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        erase_abi_cxx11_((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_208,(const_iterator)local_1f8.ld.data);
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != &local_b8._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_1c8);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_208);
    pHVar26 = local_198;
  }
  if ((pHVar26->count_solutions == true) &&
     ((__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign == false)) {
    if (1 < (__return_storage_ptr__->solution_count).m_backend.
            super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            .m_limbs) {
LAB_00128370:
      iVar8 = InputGraph::size(this);
      iVar22 = InputGraph::size(&local_190);
      lVar21 = (limb_type)(iVar8 - iVar22);
      local_108.la[0] = 0;
      local_f8 = 0;
      local_f4 = (byte)(iVar8 - iVar22 >> 0x1f) >> 7;
      local_f3 = 1;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)&local_108.ld,1,1);
      lVar17 = -lVar21;
      if (0 < (long)lVar21) {
        lVar17 = lVar21;
      }
      uVar12 = &local_108;
      if ((char)local_f3 == '\0') {
        uVar12 = local_108.ld.data;
      }
      ((data_type *)&((limb_data *)uVar12)->capacity)->la[0] = lVar17;
      local_128.la[0] = 1;
      local_118 = 1;
      local_114 = 0x100;
      local_208._0_8_ = 1;
      local_112 = '\0';
      local_1f8.la[0]._0_7_ = 0x10000000001;
      local_d8.la[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count;
      local_c8 = 1;
      local_c4 = 0x100;
      local_c2 = '\0';
      local_198 = (HomomorphismParams *)&__return_storage_ptr__->solution_count;
      do {
        if (local_1f8.la[0]._4_1_ == (char)local_c4) {
          iVar22 = boost::multiprecision::backends::
                   cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                   ::
                   compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                             ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                               *)local_208,
                              (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                               *)&local_d8.ld);
          iVar8 = -iVar22;
          if ((bool)local_1f8.la[0]._4_1_ == false) {
            iVar8 = iVar22;
          }
          if (0 < iVar8) goto LAB_00128634;
        }
        else if ((bool)local_1f8.la[0]._4_1_ == false) goto LAB_00128634;
        local_168.la[0] = (limb_type)&local_108;
        local_168.ld.data = (limb_pointer)&local_d8;
        local_158 = local_208;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::plus,boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)local_1c8,
                   (expression<boost::multiprecision::detail::plus,_boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_168.ld,(type *)0x0);
        puVar4 = local_158;
        local_168.la[0] = 0;
        uVar15 = 0;
        if ((bool)local_1f8.la[0]._6_1_ != false) {
          uVar15 = local_1f8.ld.capacity;
        }
        local_158._0_5_ = CONCAT14(local_1f8.la[0]._4_1_,uVar15);
        local_158._7_1_ = SUB81(puVar4,7);
        local_158 = (undefined1 *)
                    (CONCAT17(local_158._7_1_,
                              CONCAT16(local_1f8.la[0]._6_1_,
                                       CONCAT15(local_1f8.la[0]._6_1_,(undefined5)local_158))) ^
                    0x10000000000);
        if ((bool)local_1f8.la[0]._6_1_ == true) {
          local_168.la[0] = local_208._0_8_;
          local_168.ld.data = (limb_pointer)local_208._8_8_;
        }
        else {
          boost::multiprecision::backends::
          cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
          ::resize((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                    *)&local_168.ld,local_1f8.ld.capacity,local_1f8.ld.capacity);
          uVar12 = &local_168;
          if (local_158._5_1_ == '\0') {
            uVar12 = local_168.ld.data;
          }
          __src = (data_type *)local_208;
          if ((bool)local_1f8.la[0]._5_1_ == false) {
            __src = (data_type *)local_208._8_8_;
          }
          memcpy((void *)uVar12,__src,(local_1f8.la[0] & 0xffffffff) << 3);
        }
        local_48.arg1 = &local_1c9;
        local_48.arg2 = (type)&local_128;
        local_48.arg3 = (type)&local_168;
        boost::multiprecision::
        number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::function,boost::multiprecision::detail::number_kind_integergcd_funct<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>,void>
                  ((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                    *)local_88,&local_48,(type *)0x0);
        boost::multiprecision::backends::
        eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_128.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_88);
        boost::multiprecision::backends::
        eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_168.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_88);
        boost::multiprecision::backends::
        eval_divide<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_1c8,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_168.ld);
        boost::multiprecision::backends::
        eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_128.ld,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)&local_128,
                   (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_1c8);
        if ((local_73 == '\0') && (local_72 == '\0')) {
          operator_delete(local_80,(ulong)local_88[0] << 3);
        }
        if ((local_158._5_1_ == '\0') && (local_158._6_1_ == '\0')) {
          operator_delete(local_168.ld.data,(local_168.la[0] & 0xffffffff) << 3);
        }
        if ((local_1b8[0]._M_local_buf[5] == '\0') && (local_1b8[0]._M_local_buf[6] == '\0')) {
          operator_delete((void *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_),
                          (local_1c8._0_8_ & 0xffffffff) << 3);
        }
        boost::multiprecision::backends::
        eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                  ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                    *)local_208);
      } while( true );
    }
    plVar14 = &__return_storage_ptr__->solution_count;
    if ((__return_storage_ptr__->solution_count).m_backend.
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_internal == false) {
      plVar14 = (loooong *)
                (__return_storage_ptr__->solution_count).m_backend.
                super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                .m_data.la[1];
    }
    if ((plVar14->m_backend).
        super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        .m_data.la[0] != 0) goto LAB_00128370;
  }
LAB_00128806:
  if (local_148 != (void *)0x0) {
    operator_delete(local_148,(long)local_138 - (long)local_148);
  }
  if (local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  InputGraph::~InputGraph(&local_190);
LAB_0012884a:
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_b8);
  return __return_storage_ptr__;
LAB_00128634:
  if (((bool)local_1f8.la[0]._5_1_ == false) && ((bool)local_1f8.la[0]._6_1_ == false)) {
    operator_delete((void *)local_208._8_8_,(local_208._0_8_ & 0xffffffff) << 3);
  }
  pHVar26 = local_198;
  if ((local_c4._1_1_ == '\0') && (local_c2 == '\0')) {
    operator_delete(local_d8.ld.data,(local_d8.la[0] & 0xffffffff) << 3);
  }
  if (((char)local_f3 == '\0') && (local_f3._1_1_ == '\0')) {
    operator_delete(local_108.ld.data,(local_108.la[0] & 0xffffffff) << 3);
  }
  local_1c8._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x1;
  local_1b8[0]._M_allocated_capacity._0_4_ = 1;
  local_1b8[0]._M_local_buf[4] = '\0';
  local_1b8[0]._M_local_buf[5] = '\x01';
  local_208._0_8_ = 2;
  local_1b8[0]._M_local_buf[6] = '\0';
  local_1f8.la[0]._0_7_ = 0x10000000001;
  local_68.la[0] = local_b8._M_impl.super__Rb_tree_header._M_node_count;
  local_58 = 1;
  local_54 = 0x100;
  local_52 = '\0';
  do {
    if (local_1f8.la[0]._4_1_ == (char)local_54) {
      iVar22 = boost::multiprecision::backends::
               cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
               ::
               compare_unsigned<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                         ((cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
                           *)local_208,
                          (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                           *)&local_68.ld);
      iVar8 = -iVar22;
      if ((bool)local_1f8.la[0]._4_1_ == false) {
        iVar8 = iVar22;
      }
      if (0 < iVar8) break;
    }
    else if ((bool)local_1f8.la[0]._4_1_ == false) break;
    boost::multiprecision::backends::
    eval_multiply<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>,0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                *)&((data_type *)local_1c8)->ld,
               (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                *)local_1c8,
               (cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                *)local_208);
    boost::multiprecision::backends::
    eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              ((cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>
                *)local_208);
  } while( true );
  if (((bool)local_1f8.la[0]._5_1_ == false) && ((bool)local_1f8.la[0]._6_1_ == false)) {
    operator_delete((void *)local_208._8_8_,(local_208._0_8_ & 0xffffffff) << 3);
  }
  if ((local_54._1_1_ == '\0') && (local_52 == '\0')) {
    operator_delete(local_68.ld.data,(local_68.la[0] & 0xffffffff) << 3);
  }
  local_208._0_8_ = &local_128;
  local_208._8_8_ = (data_type *)local_1c8;
  boost::multiprecision::
  number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
  ::operator*=((number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>
                *)pHVar26,
               (expression<boost::multiprecision::detail::multiply_immediates,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                *)local_208);
  __return_storage_ptr__ = local_1d8;
  if ((local_1b8[0]._M_local_buf[5] == '\0') && (local_1b8[0]._M_local_buf[6] == '\0')) {
    operator_delete((void *)CONCAT44(local_1c8._12_4_,local_1c8._8_4_),
                    (local_1c8._0_8_ & 0xffffffff) << 3);
  }
  if ((local_114._1_1_ == '\0') && (local_112 == '\0')) {
    operator_delete(local_128.ld.data,(local_128.la[0] & 0xffffffff) << 3);
  }
  goto LAB_00128806;
}

Assistant:

auto gss::solve_sip_by_decomposition(const InputGraph & pattern, const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    set<int> isolated_pattern_vertices;
    find_removable_isolated_pattern_vertices(pattern, params, isolated_pattern_vertices);

    if (! isolated_pattern_vertices.empty()) {
        InputGraph reduced_pattern(pattern.size() - isolated_pattern_vertices.size(), pattern.has_vertex_labels(),
            pattern.has_edge_labels());

        vector<int> original_to_reduced, reduced_to_original;

        for (int i = 0; i < pattern.size(); ++i) {
            if (isolated_pattern_vertices.count(i))
                original_to_reduced.push_back(-1);
            else {
                original_to_reduced.push_back(reduced_to_original.size());
                reduced_to_original.push_back(i);
            }
        }

        for (int i = 0; i < pattern.size(); ++i) {
            auto r_i = original_to_reduced.at(i);
            if (r_i == -1)
                continue;

            for (int j = 0; j < pattern.size(); ++j) {
                auto r_j = original_to_reduced.at(j);
                if (r_j == -1)
                    continue;

                if (pattern.adjacent(i, j))
                    reduced_pattern.add_directed_edge(r_i, r_j, "");
            }
        }
        auto result = solve_homomorphism_problem(reduced_pattern, target, params);

        result.extra_stats.emplace_back("isolated_pattern_vertices = " + to_string(isolated_pattern_vertices.size()));

        // fix up the result to be in the non-decomposed form
        if (! result.mapping.empty()) {
            // need to re-add isolated vertices, arbitrarily. what's available?
            set<int> t_avail;
            for (int i = 0; i < target.size(); ++i)
                t_avail.emplace(i);

            // convert back to original indices, and remove used vertices
            auto sub_mapping = result.mapping;
            result.mapping.clear();
            for (auto & [p, t] : sub_mapping) {
                t_avail.erase(t);
                result.mapping.emplace(reduced_to_original.at(p), t);
            }

            // add in isolated vertices
            for (auto & p : isolated_pattern_vertices) {
                result.mapping.emplace(p, *t_avail.begin());
                t_avail.erase(t_avail.begin());
            }
        }

        // fix up the solution count
        if (params.count_solutions && result.solution_count > 0) {
            loooong unmapped_target_vertices = target.size() - reduced_pattern.size();
            loooong solution_multiplier = n_choose_k<loooong>(unmapped_target_vertices, isolated_pattern_vertices.size());
            loooong isolated_symmetry_multiplier = factorial<loooong>(isolated_pattern_vertices.size());
            result.solution_count *= solution_multiplier * isolated_symmetry_multiplier;
        }

        return result;
    }
    else
        return solve_homomorphism_problem(pattern, target, params);
}